

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O2

void XcmeSelectInput(XcmeContext_s *c)

{
  Display *pDVar1;
  Window WVar2;
  bool bVar3;
  undefined8 uVar4;
  Window *__ptr;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t __size;
  int iVar8;
  long lVar9;
  Window *windows;
  int format;
  Atom actual;
  unsigned_long left;
  unsigned_long nWindow;
  
  nWindow = 0;
  windows = (Window *)0x0;
  actual = 0;
  format = 0;
  left = 0;
  pDVar1 = c->display;
  WVar2 = c->root;
  uVar4 = XInternAtom(pDVar1,"_NET_CLIENT_LIST",0);
  XGetWindowProperty(pDVar1,WVar2,uVar4,0,0xffffffffffffffff,0,0x21,&actual,&format,&nWindow,&left,
                     &windows);
  lVar9 = left + nWindow;
  iVar8 = (int)lVar9;
  for (lVar7 = 0; lVar7 != iVar8; lVar7 = lVar7 + 1) {
    uVar6 = 0;
    uVar5 = (ulong)(uint)c->nWindows;
    if (c->nWindows < 1) {
      uVar5 = uVar6;
    }
    bVar3 = false;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (windows[lVar7] == c->Windows[uVar6]) {
        bVar3 = true;
      }
    }
    if ((c->w != windows[lVar7]) && (!bVar3)) {
      XSelectInput(c->display,windows[lVar7],0x408000);
    }
  }
  __ptr = c->Windows;
  __size = (lVar9 << 0x20) >> 0x1d;
  if (c->nWindows < iVar8) {
    free(__ptr);
    __ptr = (Window *)malloc(__size);
    c->Windows = __ptr;
  }
  memcpy(__ptr,windows,__size);
  c->nWindows = iVar8;
  return;
}

Assistant:

void XcmeSelectInput( XcmeContext_s * c )
{
        unsigned long nWindow = 0;
        Window * windows = 0;
  Atom actual = 0;
  int format = 0;
  unsigned long left = 0, n = 0, i,j;

        XGetWindowProperty( c->display, c->root,
          XInternAtom( c->display, "_NET_CLIENT_LIST", False), 0, ~0, False, XA_WINDOW, &actual, &format,
          &nWindow, &left, (unsigned char**)&windows );
        n = (int)(nWindow + left);

        for(i = 0; i < n; ++i)
        {
          /* search of a previous observation of a particular window */
          int found = 0;
          for(j = 0; (int)j < c->nWindows; ++j)
          {
            if(windows[i] == c->Windows[j])
              found = 1;
          }

          /* other new windows but not own */
          if( c->w != windows[i] &&
              !found )
          {
            /* observe other windows */
            XSelectInput( c->display, windows[i],
                       PropertyChangeMask |  /* Xcolor properties */
                       ExposureMask );       /* Xcolor client messages */
          }
        }

        if((int)n > c->nWindows)
        {
          if(c->Windows) free(c->Windows);
          c->Windows = (Window*)malloc( sizeof(Window) * n );
        }
        memcpy( c->Windows, windows, sizeof(Window) * n );
        c->nWindows = n;
}